

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperSTREQ
          (internal *this,char *lhs_expression,char *rhs_expression,wchar_t *lhs,wchar_t *rhs)

{
  wchar_t *rhs_expression_00;
  char *lhs_expression_00;
  bool bVar1;
  wchar_t **value;
  wchar_t **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  string local_70;
  string local_50;
  wchar_t *local_30;
  wchar_t *rhs_local;
  wchar_t *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_30 = rhs;
  rhs_local = lhs;
  lhs_local = (wchar_t *)rhs_expression;
  rhs_expression_local = lhs_expression;
  lhs_expression_local = (char *)this;
  bVar1 = String::WideCStringEquals(lhs,rhs);
  lhs_expression_00 = rhs_expression_local;
  rhs_expression_00 = lhs_local;
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    PrintToString<wchar_t_const*>(&local_50,(testing *)&rhs_local,value);
    PrintToString<wchar_t_const*>(&local_70,(testing *)&local_30,value_00);
    EqFailure(this,lhs_expression_00,(char *)rhs_expression_00,&local_50,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperSTREQ(const char* lhs_expression,
                               const char* rhs_expression,
                               const wchar_t* lhs,
                               const wchar_t* rhs) {
  if (String::WideCStringEquals(lhs, rhs)) {
    return AssertionSuccess();
  }

  return EqFailure(lhs_expression,
                   rhs_expression,
                   PrintToString(lhs),
                   PrintToString(rhs),
                   false);
}